

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

int lws_sa46_on_net(lws_sockaddr46 *sa46a,lws_sockaddr46 *sa46_net,int net_len)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = 1;
  if (((sa46a->sa4).sin_family == 2) && ((sa46_net->sa4).sin_family == 2)) {
    if (0 < net_len) {
      iVar2 = -net_len;
      uVar4 = 0xff;
      lVar3 = 4;
      do {
        iVar2 = iVar2 + 8;
        uVar5 = uVar4 & 0xff;
        uVar4 = uVar5 << ((byte)iVar2 & 0x1f);
        if (7 < (uint)net_len) {
          uVar4 = uVar5;
        }
        if ((byte)((*(byte *)((long)sa46_net + lVar3) ^ *(byte *)((long)sa46a + lVar3)) &
                  (byte)uVar4) != 0) {
          return 1;
        }
        lVar3 = lVar3 + 1;
        bVar1 = 8 < net_len;
        net_len = net_len - 8;
      } while (bVar1);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
lws_sa46_on_net(const lws_sockaddr46 *sa46a, const lws_sockaddr46 *sa46_net,
		int net_len)
{
	uint8_t mask = 0xff, norm[16];
	const uint8_t *p1, *p2;

	if (sa46a->sa4.sin_family == AF_INET) {
		p1 = (uint8_t *)&sa46a->sa4.sin_addr;
		if (sa46_net->sa4.sin_family == AF_INET6) {
			/* ip is v4, net is v6, promote ip to v6 */

			lws_4to6(norm, p1);
			p1 = norm;
		}
#if defined(LWS_WITH_IPV6)
	} else
		if (sa46a->sa4.sin_family == AF_INET6) {
			p1 = (uint8_t *)&sa46a->sa6.sin6_addr;
#endif
		} else
			return 1;

	if (sa46_net->sa4.sin_family == AF_INET) {
		p2 = (uint8_t *)&sa46_net->sa4.sin_addr;
		if (sa46a->sa4.sin_family == AF_INET6) {
			/* ip is v6, net is v4, promote net to v6 */

			lws_4to6(norm, p2);
			p2 = norm;
			/* because the mask length is for net v4 address */
			net_len += 12 * 8;
		}
#if defined(LWS_WITH_IPV6)
	} else
		if (sa46a->sa4.sin_family == AF_INET6) {
			p2 = (uint8_t *)&sa46_net->sa6.sin6_addr;
#endif
		} else
			return 1;

	while (net_len > 0) {
		if (net_len < 8)
			mask = (uint8_t)(mask << (8 - net_len));

		if (((*p1++) & mask) != ((*p2++) & mask))
			return 1;

		net_len -= 8;
	}

	return 0;
}